

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vbyte.hpp
# Opt level: O2

uint32_t vbyte_decode_u32(uint8_t **input)

{
  byte bVar1;
  uint uVar2;
  byte *pbVar3;
  uint32_t uVar4;
  uint uVar5;
  
  uVar4 = 0;
  uVar5 = 0;
  pbVar3 = *input;
  do {
    *input = pbVar3 + 1;
    bVar1 = *pbVar3;
    uVar2 = uVar5 & 0x1f;
    uVar5 = uVar5 + 7;
    uVar4 = uVar4 + ((bVar1 & 0x7f) << uVar2);
    pbVar3 = pbVar3 + 1;
  } while ((char)bVar1 < '\0');
  return uVar4;
}

Assistant:

uint32_t vbyte_decode_u32(const uint8_t*& input)
{
    uint32_t x = 0;
    uint32_t shift = 0;
    while (true) {
        uint8_t c = *input++;
        x += ((c & 127) << shift);
        if (!(c & 128)) {
            return x;
        }
        shift += 7;
    }
    return x;
}